

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_attach(REF_LAYER ref_layer,REF_GRID ref_grid,REF_INT faceid)

{
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  int cell;
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  cell = 0;
  while( true ) {
    if (ref_cell->max <= cell) {
      return 0;
    }
    RVar1 = ref_cell_nodes(ref_cell,cell,nodes);
    if (((RVar1 == 0) && (nodes[ref_cell->node_per] == faceid)) &&
       (uVar2 = ref_list_push(ref_layer->ref_list,cell), uVar2 != 0)) break;
    cell = cell + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x4a,
         "ref_layer_attach",(ulong)uVar2,"parent");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_layer_attach(REF_LAYER ref_layer, REF_GRID ref_grid,
                                    REF_INT faceid) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];

  /* copy nodes into local copy that provides compact index */
  each_ref_cell_valid_cell_with_nodes(
      ref_cell, cell, nodes) if (faceid == nodes[ref_cell_node_per(ref_cell)])
      RSS(ref_list_push(ref_layer_list(ref_layer), cell), "parent");

  return REF_SUCCESS;
}